

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NtkEliminate1(Abc_Ntk_t *pNtk,int ElimValue,int nMaxSize,int nIterMax,int fReverse,
                     int fVerbose)

{
  int iVar1;
  int iVar2;
  int local_30;
  int nNodes;
  int i;
  int fVerbose_local;
  int fReverse_local;
  int nIterMax_local;
  int nMaxSize_local;
  int ElimValue_local;
  Abc_Ntk_t *pNtk_local;
  
  local_30 = 0;
  while( true ) {
    if (nIterMax <= local_30) {
      return 1;
    }
    iVar1 = Abc_NtkNodeNum(pNtk);
    iVar2 = Abc_NtkEliminate1One(pNtk,ElimValue,nMaxSize,fReverse,fVerbose);
    if (iVar2 == 0) break;
    iVar2 = Abc_NtkNodeNum(pNtk);
    if (iVar1 == iVar2) {
      return 1;
    }
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

int Abc_NtkEliminate1( Abc_Ntk_t * pNtk, int ElimValue, int nMaxSize, int nIterMax, int fReverse, int fVerbose )
{
    int i;
    for ( i = 0; i < nIterMax; i++ )
    {
        int nNodes = Abc_NtkNodeNum(pNtk);
//        printf( "%d ", nNodes );
        if ( !Abc_NtkEliminate1One(pNtk, ElimValue, nMaxSize, fReverse, fVerbose) )
            return 0;
        if ( nNodes == Abc_NtkNodeNum(pNtk) )
            break;
    }
    return 1;
}